

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KMP_Next.cpp
# Opt level: O1

void get_nextval(string *t)

{
  ulong uVar1;
  pointer pcVar2;
  uint uVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  char *pcVar8;
  long lVar9;
  
  memset(nextval,0x3f,0x194);
  nextval[1] = 0;
  uVar1 = t->_M_string_length;
  uVar3 = 1;
  if (1 < uVar1) {
    uVar5 = 0;
    lVar4 = 1;
    uVar7 = 1;
    do {
      lVar9 = (long)(int)uVar5;
      if (((int)uVar5 == 0) || (pcVar2 = (t->_M_dataplus)._M_p, pcVar2[uVar7] == pcVar2[lVar9])) {
        lVar4 = (long)(int)lVar4;
        uVar5 = lVar9 + 1;
        pcVar2 = (t->_M_dataplus)._M_p;
        iVar6 = (int)uVar5;
        if (pcVar2[lVar4 + 1] == pcVar2[lVar9 + 1]) {
          iVar6 = nextval[lVar9 + 1];
        }
        nextval[lVar4 + 1] = iVar6;
        lVar4 = lVar4 + 1;
      }
      else {
        uVar5 = (ulong)(uint)nextval[lVar9];
      }
      uVar3 = (uint)lVar4;
      uVar7 = (ulong)(int)uVar3;
    } while (uVar7 < uVar1);
  }
  if (1 < (int)uVar3) {
    lVar4 = 0;
    do {
      pcVar8 = " ";
      if (lVar4 == 0) {
        pcVar8 = "nextval:";
      }
      lVar9 = 1;
      if (lVar4 == 0) {
        lVar9 = 8;
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,pcVar8,lVar9);
      lVar9 = std::cout;
      *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) =
           *(uint *)(__gxx_personality_v0 + *(long *)(std::cout + -0x18)) | 0x80;
      *(undefined8 *)(memmove + *(long *)(lVar9 + -0x18)) = 2;
      std::ostream::operator<<((ostream *)&std::cout,nextval[lVar4 + 1]);
      lVar4 = lVar4 + 1;
    } while ((ulong)uVar3 - 1 != lVar4);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + 'x');
  std::ostream::put('x');
  std::ostream::flush();
  return;
}

Assistant:

void get_nextval(string t) { //nudt的next
    ms(nextval,INF);
    int i = 1, j = 0;
    nextval[1] = 0;
    while(i < t.length()) {
        if(j==0 || t[i]==t[j]) {
            ++i; ++j;
            nextval[i] = (t[i]==t[j])?nextval[j]:j;
        } else {
            j = nextval[j];
        }
    }
    for(int k = 1; k < i; k++) {
        cout << (k==1?"nextval:":" ") << setiosflags(ios::right) << setw(2) << nextval[k];
    }
    cout << endl;
}